

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O3

ListServerInfo * __thiscall
RenX_ServerListPlugin::getListServerInfo
          (ListServerInfo *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  char *pcVar1;
  unsigned_short uVar2;
  ushort uVar3;
  undefined8 *puVar4;
  Config *pCVar5;
  anon_class_16_2_a2190fd3 populate_with_section;
  anon_class_16_2_a2190fd3 local_48;
  string local_38;
  
  (__return_storage_ptr__->hostname)._M_len = 0;
  (__return_storage_ptr__->hostname)._M_str = (char *)0x0;
  (__return_storage_ptr__->namePrefix)._M_len = 0;
  (__return_storage_ptr__->namePrefix)._M_str = (char *)0x0;
  (__return_storage_ptr__->attributes).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->attributes).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->attributes).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.server = server;
  local_48.result = __return_storage_ptr__;
  puVar4 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
  pcVar1 = (char *)*puVar4;
  (__return_storage_ptr__->hostname)._M_len = puVar4[1];
  (__return_storage_ptr__->hostname)._M_str = pcVar1;
  uVar2 = RenX::Server::getPort();
  __return_storage_ptr__->port = uVar2;
  pCVar5 = (Config *)
           Jupiter::Config::getSection
                     (&this->field_0x38,(__return_storage_ptr__->hostname)._M_len,
                      (__return_storage_ptr__->hostname)._M_str);
  if (pCVar5 != (Config *)0x0) {
    getListServerInfo::anon_class_16_2_a2190fd3::operator()(&local_48,pCVar5);
    uVar3 = RenX::Server::getPort();
    string_printf_abi_cxx11_(&local_38,"%u",(ulong)uVar3);
    pCVar5 = (Config *)
             Jupiter::Config::getSection(pCVar5,local_38._M_string_length,local_38._M_dataplus._M_p)
    ;
    getListServerInfo::anon_class_16_2_a2190fd3::operator()(&local_48,pCVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RenX_ServerListPlugin::ListServerInfo RenX_ServerListPlugin::getListServerInfo(const RenX::Server& server) {
	ListServerInfo result;

	auto populate_with_section = [&server, &result](Jupiter::Config* section) {
		if (section == nullptr) {
			return;
		}

		result.hostname = section->get("ListAddress"sv, result.hostname);
		result.port = section->get("ListPort"sv, result.port);
		result.namePrefix = section->get("ListNamePrefix"sv, result.namePrefix);

		// Attributes
		std::string_view attributes_str = section->get("ListAttributes"sv);
		if (!attributes_str.empty()) {
			result.attributes = jessilib::split_view(attributes_str, ' ');
		}
	};

	// Populate with standard information
	result.hostname = server.getSocketHostname();
	result.port = server.getPort();

	// Try Overwriting based on IP-named config section
	if (auto section = config.getSection(result.hostname)) {
		populate_with_section(section);

		// Try overwriting based on Port subsection
		populate_with_section(section->getSection(string_printf("%u", server.getPort())));
	}

	return result;
}